

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uoptions.cpp
# Opt level: O1

int u_parseArgs(int argc,char **argv,int optionCount,UOption *options)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  UOption *pUVar6;
  int iVar7;
  long lVar8;
  UOption *pUVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  UOption *pUVar13;
  char cVar14;
  ulong uVar15;
  int local_4c;
  
  iVar10 = 1;
  if (1 < argc) {
    iVar10 = 1;
    bVar3 = false;
    iVar11 = 1;
    do {
      pcVar12 = argv[iVar11];
      if (((bVar3) || (*pcVar12 != '-')) || (cVar14 = pcVar12[1], cVar14 == '\0')) {
        lVar8 = (long)iVar10;
        iVar10 = iVar10 + 1;
        argv[lVar8] = pcVar12;
        iVar11 = iVar11 + 1;
      }
      else {
        pcVar12 = pcVar12 + 2;
        if (cVar14 == '-') {
          if (*pcVar12 == '\0') {
            bVar3 = true;
            goto LAB_0010b9fb;
          }
          pUVar13 = options;
          uVar15 = (ulong)(uint)optionCount;
          if (0 < optionCount) {
            do {
              if ((pUVar13->longName != (char *)0x0) &&
                 (iVar7 = strcmp(pcVar12,pUVar13->longName), iVar7 == 0)) goto LAB_0010b840;
              uVar15 = uVar15 - 1;
              pUVar13 = pUVar13 + 1;
            } while (uVar15 != 0);
          }
          pUVar13 = (UOption *)0x0;
LAB_0010b840:
          if (pUVar13 == (UOption *)0x0) {
LAB_0010b888:
            local_4c = -iVar11;
            bVar4 = false;
          }
          else {
            pUVar13->doesOccur = '\x01';
            if (pUVar13->hasArg != '\0') {
              iVar7 = iVar11 + 1;
              if ((iVar7 < argc) &&
                 ((pcVar12 = argv[iVar7], *pcVar12 != '-' || (pcVar12[1] == '\0')))) {
                pUVar13->value = pcVar12;
                iVar11 = iVar7;
              }
              else if (pUVar13->hasArg == '\x01') {
                pUVar13->doesOccur = '\0';
                goto LAB_0010b888;
              }
            }
            bVar4 = true;
            if ((pUVar13->optionFn != (UOptionFn *)0x0) &&
               (iVar7 = (*pUVar13->optionFn)(pUVar13->context,pUVar13), iVar7 < 0)) {
              pUVar13->doesOccur = '\0';
              local_4c = -iVar11;
              bVar4 = false;
            }
          }
          bVar3 = false;
          bVar5 = false;
          if (bVar4) goto LAB_0010b9fb;
        }
        else {
          pUVar13 = (UOption *)0x0;
          do {
            pUVar9 = options;
            uVar15 = (ulong)(uint)optionCount;
            pUVar6 = pUVar13;
            if (0 < optionCount) {
              do {
                pUVar6 = pUVar9;
                if (cVar14 == pUVar9->shortName) break;
                pUVar9 = pUVar9 + 1;
                uVar15 = uVar15 - 1;
                pUVar6 = pUVar13;
              } while (uVar15 != 0);
            }
            pUVar13 = pUVar6;
            if (pUVar13 == (UOption *)0x0) {
              local_4c = -iVar11;
              iVar7 = 1;
              pUVar13 = (UOption *)0x0;
LAB_0010b914:
              bVar5 = false;
            }
            else {
              pUVar13->doesOccur = '\x01';
              if (pUVar13->hasArg == '\0') {
LAB_0010b937:
                if ((pUVar13->optionFn == (UOptionFn *)0x0) ||
                   (iVar7 = (*pUVar13->optionFn)(pUVar13->context,pUVar13), -1 < iVar7)) {
                  cVar14 = *pcVar12;
                  pcVar12 = pcVar12 + 1;
                  pUVar13 = (UOption *)0x0;
                  bVar5 = true;
                  iVar7 = 0;
                  goto LAB_0010b976;
                }
LAB_0010b960:
                pUVar13->doesOccur = '\0';
                local_4c = -iVar11;
                iVar7 = 1;
              }
              else {
                if (*pcVar12 == '\0') {
                  iVar1 = iVar11 + 1;
                  if ((argc <= iVar1) ||
                     ((pcVar2 = argv[iVar1], *pcVar2 == '-' && (pcVar2[1] != '\0')))) {
                    if (pUVar13->hasArg != '\x01') goto LAB_0010b937;
                    goto LAB_0010b960;
                  }
                  pUVar13->value = pcVar2;
                  iVar7 = 7;
                  iVar11 = iVar1;
                  goto LAB_0010b914;
                }
                pUVar13->value = pcVar12;
                iVar7 = 7;
              }
              bVar5 = false;
            }
LAB_0010b976:
            if (iVar7 != 0) {
              if (iVar7 == 7) {
                bVar3 = false;
                goto LAB_0010b9fb;
              }
              bVar3 = false;
              goto LAB_0010ba02;
            }
          } while (cVar14 != '\0');
          bVar3 = false;
LAB_0010b9fb:
          iVar11 = iVar11 + 1;
          bVar5 = true;
        }
LAB_0010ba02:
        if (!bVar5) {
          return local_4c;
        }
      }
    } while (iVar11 < argc);
  }
  return iVar10;
}

Assistant:

U_CAPI int U_EXPORT2
u_parseArgs(int argc, char* argv[],
            int optionCount, UOption options[]) {
    char *arg;
    int i=1, remaining=1;
    char c, stopOptions=0;

    while(i<argc) {
        arg=argv[i];
        if(!stopOptions && *arg=='-' && (c=arg[1])!=0) {
            /* process an option */
            UOption *option=NULL;
            arg+=2;
            if(c=='-') {
                /* process a long option */
                if(*arg==0) {
                    /* stop processing options after "--" */
                    stopOptions=1;
                } else {
                    /* search for the option string */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(options[j].longName && uprv_strcmp(arg, options[j].longName)==0) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }
                }
            } else {
                /* process one or more short options */
                do {
                    /* search for the option letter */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(c==options[j].shortName) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(*arg!=0) {
                            /* argument following in the same argv[] */
                            option->value=arg;
                            /* do not process the rest of this arg as option letters */
                            break;
                        } else if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                            /* this break is redundant because we know that *arg==0 */
                            break;
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }

                    /* get the next option letter */
                    option=NULL;
                    c=*arg++;
                } while(c!=0);
            }

            /* go to next argv[] */
            ++i;
        } else {
            /* move a non-option up in argv[] */
            argv[remaining++]=arg;
            ++i;
        }
    }
    return remaining;
}